

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)>::
reject<std::__exception_ptr::exception_ptr>
          (PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)> *this,exception_ptr *error)

{
  PromiseError local_20;
  exception_ptr *local_18;
  exception_ptr *error_local;
  PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)> *this_local;
  
  local_18 = error;
  error_local = (exception_ptr *)this;
  PromiseError::PromiseError(&local_20,error);
  PromiseError::operator=(&this->m_error,&local_20);
  PromiseError::~PromiseError(&local_20);
  setSettled(this);
  return;
}

Assistant:

void reject(E&& error)
    {
        Q_ASSERT(isPending());
        Q_ASSERT(m_error.isNull());
        m_error = PromiseError{std::forward<E>(error)};
        setSettled();
    }